

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_class.cpp
# Opt level: O0

void Omega_h::classify_hinges_by_sharpness
               (Mesh *mesh,Read<signed_char> *hinge_is_exposed,Read<signed_char> *hinge_is_sharp)

{
  LO size_in;
  int ent_dim;
  Write<signed_char> local_f0;
  Read<signed_char> local_e0;
  allocator local_c9;
  string local_c8 [32];
  undefined1 local_a8 [8];
  type f;
  allocator local_59;
  string local_58 [32];
  undefined1 local_38 [8];
  Write<signed_char> class_dim;
  LO nh;
  Int dim;
  Read<signed_char> *hinge_is_sharp_local;
  Read<signed_char> *hinge_is_exposed_local;
  Mesh *mesh_local;
  
  class_dim.shared_alloc_.direct_ptr._4_4_ = Mesh::dim(mesh);
  size_in = Mesh::nents(mesh,class_dim.shared_alloc_.direct_ptr._4_4_ + -2);
  class_dim.shared_alloc_.direct_ptr._0_4_ = size_in;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"",&local_59);
  Write<signed_char>::Write((Write<signed_char> *)local_38,size_in,(string *)local_58);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  Write<signed_char>::Write((Write<signed_char> *)local_a8,(Write<signed_char> *)local_38);
  f.class_dim.shared_alloc_.direct_ptr._0_4_ = class_dim.shared_alloc_.direct_ptr._4_4_;
  Read<signed_char>::Read((Read<signed_char> *)&f.dim,hinge_is_exposed);
  Read<signed_char>::Read
            ((Read<signed_char> *)&f.hinge_is_exposed.write_.shared_alloc_.direct_ptr,hinge_is_sharp
            );
  parallel_for<Omega_h::classify_hinges_by_sharpness(Omega_h::Mesh*,Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)::__0>
            ((LO)class_dim.shared_alloc_.direct_ptr,(type *)local_a8,"classify_hinges_by_sharpness")
  ;
  ent_dim = class_dim.shared_alloc_.direct_ptr._4_4_ + -2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"class_dim",&local_c9);
  Write<signed_char>::Write(&local_f0,(Write<signed_char> *)local_38);
  Read<signed_char>::Read(&local_e0,&local_f0);
  Mesh::add_tag<signed_char>(mesh,ent_dim,(string *)local_c8,1,&local_e0,false);
  Read<signed_char>::~Read(&local_e0);
  Write<signed_char>::~Write(&local_f0);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  classify_hinges_by_sharpness(Omega_h::Mesh*,Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)
  ::$_0::~__0((__0 *)local_a8);
  Write<signed_char>::~Write((Write<signed_char> *)local_38);
  return;
}

Assistant:

void classify_hinges_by_sharpness(
    Mesh* mesh, Read<I8> hinge_is_exposed, Read<I8> hinge_is_sharp) {
  auto dim = mesh->dim();
  auto nh = mesh->nents(dim - 2);
  Write<I8> class_dim(nh);
  auto f = OMEGA_H_LAMBDA(LO h) {
    class_dim[h] =
        static_cast<I8>(dim - hinge_is_exposed[h] - hinge_is_sharp[h]);
  };
  parallel_for(nh, f, "classify_hinges_by_sharpness");
  mesh->add_tag<I8>(dim - 2, "class_dim", 1, class_dim);
}